

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

Class * __thiscall
cppgenerate::Class::addParentClass
          (Class *this,string *parentName,AccessModifier inheritanceType,string *initializer)

{
  Parent p;
  undefined1 local_60 [40];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_60._0_8_ = local_60 + 0x10;
  local_60._8_8_ = 0;
  local_60[0x10] = '\0';
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_60);
  local_60._32_4_ = inheritanceType;
  std::__cxx11::string::_M_assign((string *)&local_38);
  std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::push_back
            (&this->m_parents,(value_type *)local_60);
  Parent::~Parent((Parent *)local_60);
  return this;
}

Assistant:

Class& Class::addParentClass( std::string parentName, cppgenerate::AccessModifier inheritanceType, std::string initializer ){
    Parent p;
    p.parentName = parentName;
    p.inheritanceType = inheritanceType;
    p.initializer = initializer;
    m_parents.push_back( p );

    return *this;

}